

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::js::Generator::GenerateProvides
          (Generator *this,GeneratorOptions *options,Printer *printer,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *provided)

{
  int iVar1;
  LogMessage *other;
  _Base_ptr p_Var2;
  char *text;
  _Rb_tree_header *p_Var3;
  string namespaceObject;
  LogFinisher local_91;
  Printer *local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  LogMessage local_68;
  
  p_Var2 = (provided->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(provided->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var3) {
    local_90 = printer;
    do {
      if (options->import_style == kImportCommonJsStrict) {
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_88,*(long *)(p_Var2 + 1),
                   (long)&(p_Var2[1]._M_parent)->_M_color + *(long *)(p_Var2 + 1));
        iVar1 = std::__cxx11::string::compare((ulong)&local_88,0,(char *)0x6);
        if (iVar1 != 0) {
          internal::LogMessage::LogMessage
                    (&local_68,LOGLEVEL_FATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/js/js_generator.cc"
                     ,0x6e9);
          other = internal::LogMessage::operator<<
                            (&local_68,
                             "CHECK failed: (0) == (namespaceObject.compare(0, 6, \"proto.\")): ");
          internal::LogFinisher::operator=(&local_91,other);
          internal::LogMessage::~LogMessage(&local_68);
        }
        std::__cxx11::string::erase((ulong)&local_88,0);
        io::Printer::Print<char[5],std::__cxx11::string>
                  (local_90,"goog.exportSymbol(\'$name$\', null, proto);\n",(char (*) [5])0x3958cc,
                   &local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p);
        }
      }
      else {
        if (options->import_style == kImportClosure) {
          text = "goog.provide(\'$name$\');\n";
        }
        else {
          text = "goog.exportSymbol(\'$name$\', null, global);\n";
        }
        io::Printer::Print<char[5],std::__cxx11::string>
                  (local_90,text,(char (*) [5])0x3958cc,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var2 + 1)
                  );
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var3);
  }
  return;
}

Assistant:

void Generator::GenerateProvides(const GeneratorOptions& options,
                                 io::Printer* printer,
                                 std::set<std::string>* provided) const {
  for (std::set<std::string>::iterator it = provided->begin();
       it != provided->end(); ++it) {
    if (options.import_style == GeneratorOptions::kImportClosure) {
      printer->Print("goog.provide('$name$');\n", "name", *it);
    } else {
      // We aren't using Closure's import system, but we use goog.exportSymbol()
      // to construct the expected tree of objects, eg.
      //
      //   goog.exportSymbol('foo.bar.Baz', null, this);
      //
      //   // Later generated code expects foo.bar = {} to exist:
      //   foo.bar.Baz = function() { /* ... */ }

      // Do not use global scope in strict mode
      if (options.import_style == GeneratorOptions::kImportCommonJsStrict) {
        std::string namespaceObject = *it;
        // Remove "proto." from the namespace object
        GOOGLE_CHECK_EQ(0, namespaceObject.compare(0, 6, "proto."));
        namespaceObject.erase(0, 6);
        printer->Print("goog.exportSymbol('$name$', null, proto);\n", "name",
                       namespaceObject);
      } else {
        printer->Print("goog.exportSymbol('$name$', null, global);\n", "name",
                       *it);
      }
    }
  }
}